

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v64_intrinsics_c.h
# Opt level: O3

c_v128 __thiscall simd_test_sse4_1::c_imm_v128_shr_n_u8<1>(simd_test_sse4_1 *this,c_v128 a)

{
  c_v128 cVar1;
  
  cVar1._8_8_ = CONCAT26(a.u16[3] >> 1,CONCAT24(a.u16[2] >> 1,CONCAT22(a.u16[1] >> 1,a.u16[0] >> 1))
                        ) & 0x7f7f7f7f7f7f7f7f;
  cVar1._0_8_ = CONCAT26((ushort)((ulong)this >> 0x31),
                         CONCAT24((ushort)((ulong)this >> 0x20) >> 1,
                                  CONCAT22((ushort)((ulong)this >> 0x10) >> 1,(ushort)this >> 1))) &
                0x7f7f7f7f7f7f7f7f;
  return cVar1;
}

Assistant:

SIMD_INLINE c_v64 c_v64_shr_u8(c_v64 a, unsigned int n) {
  c_v64 t;
  int c;
  if (SIMD_CHECK && n > 7) {
    fprintf(stderr, "Error: Undefined u8 shift right %d\n", n);
    abort();
  }
  for (c = 0; c < 8; c++) t.u8[c] = a.u8[c] >> n;
  return t;
}